

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DetonationPdu.cpp
# Opt level: O1

int __thiscall DIS::DetonationPdu::getMarshalledSize(DetonationPdu *this)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  pointer pVVar10;
  ulong uVar11;
  long lVar12;
  VariableParameter listElement;
  VariableParameter local_50;
  
  iVar3 = WarfareFamilyPdu::getMarshalledSize(&this->super_WarfareFamilyPdu);
  iVar4 = EntityID::getMarshalledSize(&this->_explodingEntityID);
  iVar5 = EventIdentifier::getMarshalledSize(&this->_eventID);
  iVar6 = Vector3Float::getMarshalledSize(&this->_velocity);
  iVar7 = Vector3Double::getMarshalledSize(&this->_locationInWorldCoordinates);
  iVar8 = MunitionDescriptor::getMarshalledSize(&this->_descriptor);
  iVar9 = Vector3Float::getMarshalledSize(&this->_locationOfEntityCoordinates);
  iVar3 = iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + iVar9 + 4;
  pVVar10 = (this->_variableParameters).
            super__Vector_base<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->_variableParameters).
      super__Vector_base<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar10) {
    lVar12 = 8;
    uVar11 = 0;
    do {
      local_50._vptr_VariableParameter = (_func_int **)&PTR__VariableParameter_001b6670;
      local_50._24_7_ = SUB87((ulong)*(undefined8 *)(&pVVar10->field_0xf + lVar12) >> 8,0);
      puVar1 = (undefined8 *)((long)&pVVar10->_vptr_VariableParameter + lVar12);
      local_50._8_8_ = *puVar1;
      uVar2 = puVar1[1];
      local_50._variableParameterFields1._0_7_ = (undefined7)uVar2;
      local_50._variableParameterFields1._7_1_ = (undefined1)((ulong)uVar2 >> 0x38);
      iVar4 = VariableParameter::getMarshalledSize(&local_50);
      iVar3 = iVar3 + iVar4;
      VariableParameter::~VariableParameter(&local_50);
      uVar11 = uVar11 + 1;
      pVVar10 = (this->_variableParameters).
                super__Vector_base<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>.
                _M_impl.super__Vector_impl_data._M_start;
      lVar12 = lVar12 + 0x20;
    } while (uVar11 < (ulong)((long)(this->_variableParameters).
                                    super__Vector_base<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar10 >> 5)
            );
  }
  return iVar3;
}

Assistant:

int DetonationPdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = WarfareFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + _explodingEntityID.getMarshalledSize();  // _explodingEntityID
   marshalSize = marshalSize + _eventID.getMarshalledSize();  // _eventID
   marshalSize = marshalSize + _velocity.getMarshalledSize();  // _velocity
   marshalSize = marshalSize + _locationInWorldCoordinates.getMarshalledSize();  // _locationInWorldCoordinates
   marshalSize = marshalSize + _descriptor.getMarshalledSize();  // _descriptor
   marshalSize = marshalSize + _locationOfEntityCoordinates.getMarshalledSize();  // _locationOfEntityCoordinates
   marshalSize = marshalSize + 1;  // _detonationResult
   marshalSize = marshalSize + 1;  // _numberOfVariableParameters
   marshalSize = marshalSize + 2;  // _pad

   for(unsigned long long idx=0; idx < _variableParameters.size(); idx++)
   {
        VariableParameter listElement = _variableParameters[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}